

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<void_(int,_int,_mp::ComplInfo)>::~TypedExpectation
          (TypedExpectation<void_(int,_int,_mp::ComplInfo)> *this)

{
  linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002bb570;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_> *)*ppvVar1;
    if (this_00 != (linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_>::~linked_ptr(this_00);
    }
    operator_delete(this_00,0x10);
  }
  linked_ptr<testing::ActionInterface<void_(int,_int,_mp::ComplInfo)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  MatcherBase<const_std::tuple<int,_int,_mp::ComplInfo>_&>::~MatcherBase
            (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<int,_int,_mp::ComplInfo>_&>)
  ;
  std::
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>::
  ~_Tuple_impl(&(this->matchers_).
                super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<mp::ComplInfo>_>
              );
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }